

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::StructDef::Deserialize(StructDef *this,Parser *parser,Object *object)

{
  SymbolTable<flatbuffers::Value> *attributes;
  pointer pcVar1;
  long lVar2;
  long lVar3;
  StructDef *pSVar4;
  bool bVar5;
  const_iterator cVar6;
  FieldDef *this_00;
  size_t sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  ulong uVar12;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  Object *pOVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  long local_a0;
  string local_98;
  StructDef *local_78;
  Parser *local_70;
  bool *local_68;
  Object *local_60;
  SymbolTable<flatbuffers::FieldDef> *local_58;
  string local_50;
  
  if ((*(ushort *)(object + -(long)*(int *)object) < 0xf) ||
     (uVar13 = (ulong)*(ushort *)(object + (0xe - (long)*(int *)object)), uVar13 == 0)) {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
  }
  else {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
            (object + *(uint *)(object + uVar13) + uVar13);
  }
  attributes = &(this->super_Definition).attributes;
  local_70 = parser;
  bVar5 = DeserializeAttributesCommon(attributes,parser,attrs);
  if (bVar5) {
    if ((*(ushort *)(object + -(long)*(int *)object) < 0x11) ||
       (uVar13 = (ulong)*(ushort *)(object + (0x10 - (long)*(int *)object)), uVar13 == 0)) {
      documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
    }
    else {
      documentation =
           (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
           (object + *(uint *)(object + uVar13) + uVar13);
    }
    local_78 = this;
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    uVar13 = (ulong)*(ushort *)(object + (4 - (long)*(int *)object));
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,object + (ulong)*(uint *)(object + uVar13) + 4 + uVar13,
               object + (ulong)*(uint *)(object + (ulong)*(uint *)(object + uVar13) + 4 + uVar13 +
                                        -4) + *(uint *)(object + uVar13) + uVar13 + 4);
    Parser::UnqualifiedName(&local_98,local_70,&local_50);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    paVar8 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar8) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pSVar4 = local_78;
    local_78->predecl = false;
    local_98._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"original_order","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)attributes,&local_98);
    if ((_Rb_tree_header *)cVar6._M_node ==
        &(pSVar4->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      bVar9 = pSVar4->fixed ^ 1;
    }
    else {
      bVar9 = pSVar4->fixed ^ 1;
      if (*(long *)(cVar6._M_node + 2) != 0) {
        bVar9 = false;
      }
    }
    local_68 = &pSVar4->fixed;
    pSVar4->sortbysize = (bool)bVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar8) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((*(ushort *)(object + -(long)*(int *)object) < 7) ||
       (uVar13 = (ulong)*(ushort *)(object + (6 - (long)*(int *)object)), uVar13 == 0)) {
      pOVar16 = (Object *)0x0;
    }
    else {
      pOVar16 = object + *(uint *)(object + uVar13) + uVar13;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
               (ulong)*(uint *)pOVar16,(allocator_type *)&local_50);
    if (*(uint *)pOVar16 != 0) {
      uVar10 = 0;
      uVar13 = 0;
      do {
        lVar2 = (ulong)uVar10 + 4;
        lVar3 = (ulong)*(uint *)(pOVar16 + (ulong)uVar10 + 4) + lVar2;
        if ((*(ushort *)
              (pOVar16 +
              (lVar3 - *(int *)(pOVar16 + (ulong)*(uint *)(pOVar16 + (ulong)uVar10 + 4) + lVar2))) <
             9) || ((ulong)*(ushort *)
                            (pOVar16 +
                            ((lVar3 + 8) -
                            (long)*(int *)(pOVar16 +
                                          (ulong)*(uint *)(pOVar16 + (ulong)uVar10 + 4) + lVar2)))
                    == 0)) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)*(ushort *)
                           (pOVar16 +
                           (ulong)*(ushort *)
                                   (pOVar16 +
                                   ((lVar3 + 8) -
                                   (long)*(int *)(pOVar16 +
                                                 (ulong)*(uint *)(pOVar16 + (ulong)uVar10 + 4) +
                                                 lVar2))) + lVar3);
        }
        *(int *)(local_98._M_dataplus._M_p + uVar12 * 4) = (int)uVar13;
        uVar13 = uVar13 + 1;
        uVar10 = uVar10 + 4;
      } while (uVar13 < *(uint *)pOVar16);
    }
    local_a0 = 0;
    if ((pointer)local_98._M_string_length != local_98._M_dataplus._M_p) {
      local_58 = &pSVar4->fields;
      uVar13 = 0;
      local_a0 = 0;
      local_60 = object;
      do {
        if (*(uint *)pOVar16 <= *(uint *)(local_98._M_dataplus._M_p + uVar13 * 4))
        goto LAB_001232e1;
        uVar12 = (ulong)(*(uint *)(local_98._M_dataplus._M_p + uVar13 * 4) << 2);
        uVar10 = *(uint *)(pOVar16 + uVar12 + 4);
        this_00 = (FieldDef *)operator_new(0x138);
        FieldDef::FieldDef(this_00);
        bVar5 = FieldDef::Deserialize
                          (this_00,local_70,(Field *)(pOVar16 + (ulong)uVar10 + uVar12 + 4));
        if ((!bVar5) ||
           (bVar5 = SymbolTable<flatbuffers::FieldDef>::Add(local_58,(string *)this_00,this_00),
           bVar5)) {
LAB_00123241:
          pcVar1 = (this_00->value).constant._M_dataplus._M_p;
          paVar8 = &(this_00->value).constant.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != paVar8) {
            operator_delete(pcVar1,paVar8->_M_allocated_capacity + 1);
          }
          SymbolTable<flatbuffers::Value>::~SymbolTable(&(this_00->super_Definition).attributes);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&(this_00->super_Definition).doc_comment);
          pcVar1 = (this_00->super_Definition).file._M_dataplus._M_p;
          paVar8 = &(this_00->super_Definition).file.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != paVar8) {
            operator_delete(pcVar1,paVar8->_M_allocated_capacity + 1);
          }
          pcVar1 = (this_00->super_Definition).name._M_dataplus._M_p;
          paVar8 = &(this_00->super_Definition).name.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != paVar8) {
            operator_delete(pcVar1,paVar8->_M_allocated_capacity + 1);
          }
          operator_delete(this_00,0x138);
          bVar5 = false;
          goto LAB_001232b9;
        }
        if (this_00->key == true) {
          if (local_78->has_key == true) goto LAB_00123241;
          local_78->has_key = true;
        }
        if (*local_68 == false) {
          uVar12 = (long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p) >> 2;
        }
        else {
          sVar7 = InlineSize(&(this_00->value).type);
          uVar12 = (long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p) >> 2;
          if (uVar13 + 1 < uVar12) {
            if (*(uint *)pOVar16 <= *(uint *)(local_98._M_dataplus._M_p + uVar13 * 4 + 4)) {
LAB_001232e1:
              __assert_fail("i < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                            ,0xc1,
                            "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
                           );
            }
            uVar14 = (ulong)(*(uint *)(local_98._M_dataplus._M_p + uVar13 * 4 + 4) << 2);
            lVar2 = uVar14 + 4;
            lVar3 = (ulong)*(uint *)(pOVar16 + uVar14 + 4) + lVar2;
            if ((*(ushort *)
                  (pOVar16 +
                  (lVar3 - *(int *)(pOVar16 + (ulong)*(uint *)(pOVar16 + uVar14 + 4) + lVar2))) <
                 0xb) || ((ulong)*(ushort *)
                                  (pOVar16 +
                                  ((lVar3 + 10) -
                                  (long)*(int *)(pOVar16 +
                                                (ulong)*(uint *)(pOVar16 + uVar14 + 4) + lVar2))) ==
                          0)) {
              uVar14 = 0;
            }
            else {
              uVar14 = (ulong)*(ushort *)
                               (pOVar16 +
                               (ulong)*(ushort *)
                                       (pOVar16 +
                                       ((lVar3 + 10) -
                                       (long)*(int *)(pOVar16 +
                                                     (ulong)*(uint *)(pOVar16 + uVar14 + 4) + lVar2)
                                       )) + lVar3);
            }
            sVar15 = uVar14 - ((this_00->value).offset + sVar7);
          }
          else {
            sVar15 = local_78->minalign - 1 & -(local_a0 + sVar7);
          }
          this_00->padding = sVar15;
          local_a0 = local_a0 + sVar7 + sVar15;
        }
        uVar13 = uVar13 + 1;
        object = local_60;
      } while (uVar13 < uVar12);
    }
    iVar11 = 0;
    if ((0xc < *(ushort *)(object + -(long)*(int *)object)) &&
       ((ulong)*(ushort *)(object + (0xc - (long)*(int *)object)) != 0)) {
      iVar11 = *(int *)(object + *(ushort *)(object + (0xc - (long)*(int *)object)));
    }
    bVar5 = true;
    if (iVar11 != (int)local_a0) {
      __assert_fail("static_cast<int>(tmp_struct_size) == object->bytesize()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0xfc0,
                    "bool flatbuffers::StructDef::Deserialize(Parser &, const reflection::Object *)"
                   );
    }
LAB_001232b9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_98._M_dataplus._M_p,
                      local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool StructDef::Deserialize(Parser &parser, const reflection::Object *object) {
  if (!DeserializeAttributes(parser, object->attributes())) return false;
  DeserializeDoc(doc_comment, object->documentation());
  name = parser.UnqualifiedName(object->name()->str());
  predecl = false;
  sortbysize = attributes.Lookup("original_order") == nullptr && !fixed;
  const auto &of = *(object->fields());
  auto indexes = std::vector<uoffset_t>(of.size());
  for (uoffset_t i = 0; i < of.size(); i++) indexes[of.Get(i)->id()] = i;
  size_t tmp_struct_size = 0;
  for (size_t i = 0; i < indexes.size(); i++) {
    auto field = of.Get(indexes[i]);
    auto field_def = new FieldDef();
    if (!field_def->Deserialize(parser, field) ||
        fields.Add(field_def->name, field_def)) {
      delete field_def;
      return false;
    }
    if (field_def->key) {
      if (has_key) {
        // only one field may be set as key
        delete field_def;
        return false;
      }
      has_key = true;
    }
    if (fixed) {
      // Recompute padding since that's currently not serialized.
      auto size = InlineSize(field_def->value.type);
      auto next_field =
          i + 1 < indexes.size() ? of.Get(indexes[i + 1]) : nullptr;
      tmp_struct_size += size;
      field_def->padding =
          next_field ? (next_field->offset() - field_def->value.offset) - size
                     : PaddingBytes(tmp_struct_size, minalign);
      tmp_struct_size += field_def->padding;
    }
  }
  FLATBUFFERS_ASSERT(static_cast<int>(tmp_struct_size) == object->bytesize());
  return true;
}